

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v11::detail::
for_each_codepoint<fmt::v11::detail::compute_width(fmt::v11::basic_string_view<char>)::count_code_points>
          (detail *this,string_view s,count_code_points f)

{
  detail *ptr;
  long lVar1;
  char *pcVar2;
  char *pcVar3;
  long lVar4;
  char buf [7];
  anon_class_8_1_54a39806 decode;
  undefined4 local_38;
  undefined3 uStack_34;
  count_code_points local_30;
  
  local_30.count = (size_t *)s.size_;
  pcVar3 = s.data_;
  ptr = this;
  if (pcVar3 < (char *)0x4) {
LAB_0018b39a:
    lVar4 = (long)(this + (long)pcVar3) - (long)ptr;
    if (lVar4 != 0) {
      uStack_34 = 0;
      local_38 = 0;
      for (lVar1 = 0; lVar4 != lVar1; lVar1 = lVar1 + 1) {
        *(detail *)((long)&local_38 + lVar1) = ptr[lVar1];
      }
      pcVar3 = (char *)&local_38;
      do {
        pcVar2 = for_each_codepoint<count_code_points>::anon_class_8_1_54a39806::operator()
                           ((anon_class_8_1_54a39806 *)&local_30,pcVar3,(char *)ptr);
        if (pcVar2 == (char *)0x0) {
          return;
        }
        ptr = ptr + ((long)pcVar2 - (long)pcVar3);
        pcVar3 = pcVar2;
      } while (pcVar2 < (char *)((long)&local_38 + lVar4));
    }
  }
  else {
    do {
      if (this + (long)pcVar3 + -3 <= ptr) goto LAB_0018b39a;
      ptr = (detail *)
            for_each_codepoint<count_code_points>::anon_class_8_1_54a39806::operator()
                      ((anon_class_8_1_54a39806 *)&local_30,(char *)ptr,(char *)ptr);
    } while (ptr != (detail *)0x0);
  }
  return;
}

Assistant:

FMT_CONSTEXPR void for_each_codepoint(string_view s, F f) {
  auto decode = [f](const char* buf_ptr, const char* ptr) {
    auto cp = uint32_t();
    auto error = 0;
    auto end = utf8_decode(buf_ptr, &cp, &error);
    bool result = f(error ? invalid_code_point : cp,
                    string_view(ptr, error ? 1 : to_unsigned(end - buf_ptr)));
    return result ? (error ? buf_ptr + 1 : end) : nullptr;
  };

  auto p = s.data();
  const size_t block_size = 4;  // utf8_decode always reads blocks of 4 chars.
  if (s.size() >= block_size) {
    for (auto end = p + s.size() - block_size + 1; p < end;) {
      p = decode(p, p);
      if (!p) return;
    }
  }
  auto num_chars_left = to_unsigned(s.data() + s.size() - p);
  if (num_chars_left == 0) return;

  // Suppress bogus -Wstringop-overflow.
  if (FMT_GCC_VERSION) num_chars_left &= 3;
  char buf[2 * block_size - 1] = {};
  copy<char>(p, p + num_chars_left, buf);
  const char* buf_ptr = buf;
  do {
    auto end = decode(buf_ptr, p);
    if (!end) return;
    p += end - buf_ptr;
    buf_ptr = end;
  } while (buf_ptr < buf + num_chars_left);
}